

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O1

void test_arithm<double>(uint length,double value1,double value2,bool allowTrash)

{
  _func_int **pp_Var1;
  ulong uVar2;
  _func_int **pp_Var3;
  double dVar4;
  int iVar5;
  undefined8 *puVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  ulong uVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  uint uVar11;
  ulong uVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var13;
  undefined1 auVar14 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var20;
  double dVar21;
  double dVar22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  shared_ptr<double> pv1;
  shared_ptr<double> pv2;
  shared_ptr<double> presult;
  
  uVar2 = (ulong)length;
  iVar5 = posix_memalign(&pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi,0x10,(long)(int)length << 3);
  local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar5 == 0) {
    local_60 = pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<double*,void(*)(double*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv1,local_60,sse::common::free<double>);
  iVar5 = posix_memalign(&pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi,0x10,(long)(int)length << 3);
  pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar5 == 0) {
    pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
         pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<double*,void(*)(double*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv2,
             pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             sse::common::free<double>);
  iVar5 = posix_memalign(&local_68,0x10,(long)(int)(length + 1) << 3);
  if (iVar5 != 0) {
    local_68 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_68;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<double*,void(*)(double*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&presult,local_68,
             sse::common::free<double>);
  (&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base)[uVar2] = (_func_int **)0x405fc00000000000;
  p_Var7 = local_60;
  uVar9 = uVar2;
  uVar11 = length;
  if (7 < (int)length) {
    do {
      p_Var7->_vptr__Sp_counted_base = (_func_int **)value1;
      *(double *)&p_Var7->_M_use_count = value1;
      p_Var7[1]._vptr__Sp_counted_base = (_func_int **)value1;
      *(double *)&p_Var7[1]._M_use_count = value1;
      p_Var7[2]._vptr__Sp_counted_base = (_func_int **)value1;
      *(double *)&p_Var7[2]._M_use_count = value1;
      p_Var7[3]._vptr__Sp_counted_base = (_func_int **)value1;
      *(double *)&p_Var7[3]._M_use_count = value1;
      iVar5 = (int)uVar9;
      uVar11 = iVar5 - 8;
      p_Var7 = p_Var7 + 4;
      uVar9 = (ulong)uVar11;
    } while (0xf < iVar5);
  }
  if (3 < (int)uVar11) {
    p_Var7->_vptr__Sp_counted_base = (_func_int **)value1;
    *(double *)&p_Var7->_M_use_count = value1;
    p_Var7[1]._vptr__Sp_counted_base = (_func_int **)value1;
    *(double *)&p_Var7[1]._M_use_count = value1;
    uVar11 = uVar11 - 4;
    p_Var7 = p_Var7 + 2;
  }
  if (1 < (int)uVar11) {
    p_Var7->_vptr__Sp_counted_base = (_func_int **)value1;
    *(double *)&p_Var7->_M_use_count = value1;
    uVar11 = uVar11 - 2;
    p_Var7 = p_Var7 + 1;
  }
  if (uVar11 != 0) {
    p_Var7->_vptr__Sp_counted_base = (_func_int **)value1;
  }
  _Var13._8_8_ = value2;
  _Var13._vptr__Sp_counted_base = (_func_int **)value2;
  _Var8 = pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  uVar9 = uVar2;
  uVar11 = length;
  if (7 < (int)length) {
    do {
      *_Var8._M_pi = _Var13;
      _Var8._M_pi[1] = _Var13;
      _Var8._M_pi[2] = _Var13;
      _Var8._M_pi[3] = _Var13;
      iVar5 = (int)uVar9;
      uVar11 = iVar5 - 8;
      _Var8._M_pi = _Var8._M_pi + 4;
      uVar9 = (ulong)uVar11;
    } while (0xf < iVar5);
  }
  if (3 < (int)uVar11) {
    *_Var8._M_pi = _Var13;
    _Var8._M_pi[1] = _Var13;
    uVar11 = uVar11 - 4;
    _Var8._M_pi = _Var8._M_pi + 2;
  }
  if (1 < (int)uVar11) {
    *_Var8._M_pi = _Var13;
    uVar11 = uVar11 - 2;
    _Var8._M_pi = _Var8._M_pi + 1;
  }
  if (uVar11 != 0) {
    (_Var8._M_pi)->_vptr__Sp_counted_base = (_func_int **)value2;
  }
  if (length != 0) {
    uVar9 = 0;
    do {
      dVar17 = (double)(&local_60->_vptr__Sp_counted_base)[uVar9] - value1;
      uVar12 = -(ulong)(dVar17 < 0.0);
      if ((2.220446049250313e-16 <=
           (double)(~uVar12 & (ulong)dVar17 |
                   (ulong)(value1 - (double)(&local_60->_vptr__Sp_counted_base)[uVar9]) & uVar12))
         || (dVar17 = (double)(&(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar9] - value2,
            uVar12 = -(ulong)(dVar17 < 0.0),
            2.220446049250313e-16 <=
            (double)(~uVar12 & (ulong)dVar17 |
                    (ulong)(value2 - (double)(&(pv1.
                                                super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar9])
                    & uVar12))) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar6 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
        *(undefined4 *)(puVar6 + 1) = 0x1a;
        *(uint *)((long)puVar6 + 0xc) = length;
        __cxa_throw(puVar6,&Exception::typeinfo,0);
      }
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
  }
  _Var8._M_pi = pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  _Var10 = pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  p_Var7 = local_60;
  uVar9 = uVar2;
  uVar11 = length;
  if (3 < (int)length) {
    do {
      dVar19 = *(double *)&p_Var7->_M_use_count;
      pp_Var3 = p_Var7[1]._vptr__Sp_counted_base;
      dVar21 = *(double *)&p_Var7[1]._M_use_count;
      dVar17 = *(double *)&(_Var10._M_pi)->_M_use_count;
      pp_Var1 = _Var10._M_pi[1]._vptr__Sp_counted_base;
      dVar18 = *(double *)&_Var10._M_pi[1]._M_use_count;
      (_Var8._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)
           ((double)p_Var7->_vptr__Sp_counted_base + (double)(_Var10._M_pi)->_vptr__Sp_counted_base)
      ;
      *(double *)&(_Var8._M_pi)->_M_use_count = dVar19 + dVar17;
      _Var8._M_pi[1]._vptr__Sp_counted_base = (_func_int **)((double)pp_Var3 + (double)pp_Var1);
      *(double *)&_Var8._M_pi[1]._M_use_count = dVar21 + dVar18;
      iVar5 = (int)uVar9;
      uVar11 = iVar5 - 4;
      p_Var7 = p_Var7 + 2;
      _Var10._M_pi = _Var10._M_pi + 2;
      _Var8._M_pi = _Var8._M_pi + 2;
      uVar9 = (ulong)uVar11;
    } while (7 < iVar5);
  }
  if (1 < (int)uVar11) {
    dVar18 = *(double *)&p_Var7->_M_use_count;
    dVar17 = *(double *)&(_Var10._M_pi)->_M_use_count;
    (_Var8._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)
         ((double)p_Var7->_vptr__Sp_counted_base + (double)(_Var10._M_pi)->_vptr__Sp_counted_base);
    *(double *)&(_Var8._M_pi)->_M_use_count = dVar18 + dVar17;
    uVar11 = uVar11 - 2;
    p_Var7 = p_Var7 + 1;
    _Var10._M_pi = _Var10._M_pi + 1;
    _Var8._M_pi = _Var8._M_pi + 1;
  }
  if (uVar11 != 0) {
    (_Var8._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)
         ((double)p_Var7->_vptr__Sp_counted_base + (double)(_Var10._M_pi)->_vptr__Sp_counted_base);
  }
  dVar17 = value1 + value2;
  if (length != 0) {
    uVar9 = 0;
    do {
      dVar18 = (double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_vptr__Sp_counted_base)[uVar9] - dVar17;
      uVar12 = -(ulong)(dVar18 < 0.0);
      if (2.220446049250313e-16 <=
          (double)(~uVar12 & (ulong)dVar18 |
                  (ulong)(dVar17 - (double)(&(pv2.
                                              super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar9]) &
                  uVar12)) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar6 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
        *(undefined4 *)(puVar6 + 1) = 0x22;
        *(uint *)((long)puVar6 + 0xc) = length;
        __cxa_throw(puVar6,&Exception::typeinfo,0);
      }
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
  }
  _Var8._M_pi = pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  _Var10 = pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  p_Var7 = local_60;
  uVar9 = uVar2;
  uVar11 = length;
  if (3 < (int)length) {
    do {
      dVar18 = *(double *)&p_Var7->_M_use_count;
      pp_Var1 = p_Var7[1]._vptr__Sp_counted_base;
      dVar19 = *(double *)&p_Var7[1]._M_use_count;
      dVar21 = *(double *)&(_Var10._M_pi)->_M_use_count;
      pp_Var3 = _Var10._M_pi[1]._vptr__Sp_counted_base;
      dVar22 = *(double *)&_Var10._M_pi[1]._M_use_count;
      (_Var8._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)
           ((double)p_Var7->_vptr__Sp_counted_base - (double)(_Var10._M_pi)->_vptr__Sp_counted_base)
      ;
      *(double *)&(_Var8._M_pi)->_M_use_count = dVar18 - dVar21;
      _Var8._M_pi[1]._vptr__Sp_counted_base = (_func_int **)((double)pp_Var1 - (double)pp_Var3);
      *(double *)&_Var8._M_pi[1]._M_use_count = dVar19 - dVar22;
      iVar5 = (int)uVar9;
      uVar11 = iVar5 - 4;
      p_Var7 = p_Var7 + 2;
      _Var10._M_pi = _Var10._M_pi + 2;
      _Var8._M_pi = _Var8._M_pi + 2;
      uVar9 = (ulong)uVar11;
    } while (7 < iVar5);
  }
  if (1 < (int)uVar11) {
    dVar18 = *(double *)&p_Var7->_M_use_count;
    dVar19 = *(double *)&(_Var10._M_pi)->_M_use_count;
    (_Var8._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)
         ((double)p_Var7->_vptr__Sp_counted_base - (double)(_Var10._M_pi)->_vptr__Sp_counted_base);
    *(double *)&(_Var8._M_pi)->_M_use_count = dVar18 - dVar19;
    uVar11 = uVar11 - 2;
    p_Var7 = p_Var7 + 1;
    _Var10._M_pi = _Var10._M_pi + 1;
    _Var8._M_pi = _Var8._M_pi + 1;
  }
  if (uVar11 != 0) {
    (_Var8._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)
         ((double)p_Var7->_vptr__Sp_counted_base - (double)(_Var10._M_pi)->_vptr__Sp_counted_base);
  }
  dVar18 = value1 - value2;
  if (length != 0) {
    uVar9 = 0;
    do {
      dVar19 = (double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_vptr__Sp_counted_base)[uVar9] - dVar18;
      uVar12 = -(ulong)(dVar19 < 0.0);
      if (2.220446049250313e-16 <=
          (double)(~uVar12 & (ulong)dVar19 |
                  (ulong)(dVar18 - (double)(&(pv2.
                                              super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar9]) &
                  uVar12)) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar6 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
        *(undefined4 *)(puVar6 + 1) = 0x2a;
        *(uint *)((long)puVar6 + 0xc) = length;
        __cxa_throw(puVar6,&Exception::typeinfo,0);
      }
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
  }
  _Var8._M_pi = pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  _Var10 = pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  p_Var7 = local_60;
  uVar9 = uVar2;
  uVar11 = length;
  if (3 < (int)length) {
    do {
      dVar19 = *(double *)&p_Var7->_M_use_count;
      pp_Var1 = p_Var7[1]._vptr__Sp_counted_base;
      dVar21 = *(double *)&p_Var7[1]._M_use_count;
      dVar22 = *(double *)&(_Var10._M_pi)->_M_use_count;
      pp_Var3 = _Var10._M_pi[1]._vptr__Sp_counted_base;
      dVar4 = *(double *)&_Var10._M_pi[1]._M_use_count;
      (_Var8._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)
           ((double)p_Var7->_vptr__Sp_counted_base * (double)(_Var10._M_pi)->_vptr__Sp_counted_base)
      ;
      *(double *)&(_Var8._M_pi)->_M_use_count = dVar19 * dVar22;
      _Var8._M_pi[1]._vptr__Sp_counted_base = (_func_int **)((double)pp_Var1 * (double)pp_Var3);
      *(double *)&_Var8._M_pi[1]._M_use_count = dVar21 * dVar4;
      iVar5 = (int)uVar9;
      uVar11 = iVar5 - 4;
      p_Var7 = p_Var7 + 2;
      _Var10._M_pi = _Var10._M_pi + 2;
      _Var8._M_pi = _Var8._M_pi + 2;
      uVar9 = (ulong)uVar11;
    } while (7 < iVar5);
  }
  if (1 < (int)uVar11) {
    dVar19 = *(double *)&p_Var7->_M_use_count;
    dVar21 = *(double *)&(_Var10._M_pi)->_M_use_count;
    (_Var8._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)
         ((double)p_Var7->_vptr__Sp_counted_base * (double)(_Var10._M_pi)->_vptr__Sp_counted_base);
    *(double *)&(_Var8._M_pi)->_M_use_count = dVar19 * dVar21;
    uVar11 = uVar11 - 2;
    p_Var7 = p_Var7 + 1;
    _Var10._M_pi = _Var10._M_pi + 1;
    _Var8._M_pi = _Var8._M_pi + 1;
  }
  if (uVar11 != 0) {
    (_Var8._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)
         ((double)p_Var7->_vptr__Sp_counted_base * (double)(_Var10._M_pi)->_vptr__Sp_counted_base);
  }
  dVar19 = value1 * value2;
  if (length != 0) {
    uVar9 = 0;
    do {
      dVar21 = (double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_vptr__Sp_counted_base)[uVar9] - dVar19;
      uVar12 = -(ulong)(dVar21 < 0.0);
      if (2.220446049250313e-16 <=
          (double)(~uVar12 & (ulong)dVar21 |
                  (ulong)(dVar19 - (double)(&(pv2.
                                              super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar9]) &
                  uVar12)) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar6 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
        *(undefined4 *)(puVar6 + 1) = 0x32;
        *(uint *)((long)puVar6 + 0xc) = length;
        __cxa_throw(puVar6,&Exception::typeinfo,0);
      }
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
  }
  _Var8 = pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  _Var10._M_pi = pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var7 = local_60;
  uVar9 = uVar2;
  uVar11 = length;
  if (3 < (int)length) {
    do {
      _Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               divpd((undefined1  [16])*p_Var7,(undefined1  [16])*_Var8._M_pi);
      _Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               divpd((undefined1  [16])p_Var7[1],(undefined1  [16])_Var8._M_pi[1]);
      *_Var10._M_pi = _Var15;
      _Var10._M_pi[1] = _Var20;
      iVar5 = (int)uVar9;
      uVar11 = iVar5 - 4;
      p_Var7 = p_Var7 + 2;
      _Var8._M_pi = _Var8._M_pi + 2;
      _Var10._M_pi = _Var10._M_pi + 2;
      uVar9 = (ulong)uVar11;
    } while (7 < iVar5);
  }
  if (1 < (int)uVar11) {
    _Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
             divpd((undefined1  [16])*p_Var7,(undefined1  [16])*_Var8._M_pi);
    *_Var10._M_pi = _Var15;
    uVar11 = uVar11 - 2;
    p_Var7 = p_Var7 + 1;
    _Var8._M_pi = _Var8._M_pi + 1;
    _Var10._M_pi = _Var10._M_pi + 1;
  }
  if (uVar11 != 0) {
    (_Var10._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)
         ((double)p_Var7->_vptr__Sp_counted_base / (double)(_Var8._M_pi)->_vptr__Sp_counted_base);
  }
  dVar21 = value1 / value2;
  if (length != 0) {
    uVar9 = 0;
    do {
      dVar22 = (double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_vptr__Sp_counted_base)[uVar9] - dVar21;
      uVar12 = -(ulong)(dVar22 < 0.0);
      if (2.220446049250313e-16 <=
          (double)(~uVar12 & (ulong)dVar22 |
                  (ulong)(dVar21 - (double)(&(pv2.
                                              super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar9]) &
                  uVar12)) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar6 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
        *(undefined4 *)(puVar6 + 1) = 0x3a;
        *(uint *)((long)puVar6 + 0xc) = length;
        __cxa_throw(puVar6,&Exception::typeinfo,0);
      }
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
  }
  _Var8._M_pi = pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var7 = local_60;
  uVar9 = uVar2;
  uVar11 = length;
  if (3 < (int)length) {
    do {
      dVar22 = *(double *)&p_Var7->_M_use_count;
      pp_Var1 = p_Var7[1]._vptr__Sp_counted_base;
      dVar4 = *(double *)&p_Var7[1]._M_use_count;
      (_Var8._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)((double)p_Var7->_vptr__Sp_counted_base + value2);
      *(double *)&(_Var8._M_pi)->_M_use_count = dVar22 + value2;
      _Var8._M_pi[1]._vptr__Sp_counted_base = (_func_int **)((double)pp_Var1 + value2);
      *(double *)&_Var8._M_pi[1]._M_use_count = dVar4 + value2;
      iVar5 = (int)uVar9;
      uVar11 = iVar5 - 4;
      p_Var7 = p_Var7 + 2;
      _Var8._M_pi = _Var8._M_pi + 2;
      uVar9 = (ulong)uVar11;
    } while (7 < iVar5);
  }
  if (1 < (int)uVar11) {
    dVar22 = *(double *)&p_Var7->_M_use_count;
    (_Var8._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)((double)p_Var7->_vptr__Sp_counted_base + value2);
    *(double *)&(_Var8._M_pi)->_M_use_count = dVar22 + value2;
    uVar11 = uVar11 - 2;
    p_Var7 = p_Var7 + 1;
    _Var8._M_pi = _Var8._M_pi + 1;
  }
  if (uVar11 != 0) {
    (_Var8._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)((double)p_Var7->_vptr__Sp_counted_base + value2);
  }
  if (length != 0) {
    uVar9 = 0;
    do {
      dVar22 = (double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_vptr__Sp_counted_base)[uVar9] - dVar17;
      uVar12 = -(ulong)(dVar22 < 0.0);
      if (2.220446049250313e-16 <=
          (double)(~uVar12 & (ulong)dVar22 |
                  (ulong)(dVar17 - (double)(&(pv2.
                                              super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar9]) &
                  uVar12)) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar6 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
        *(undefined4 *)(puVar6 + 1) = 0x43;
        *(uint *)((long)puVar6 + 0xc) = length;
        __cxa_throw(puVar6,&Exception::typeinfo,0);
      }
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
  }
  _Var8._M_pi = pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var7 = local_60;
  uVar9 = uVar2;
  uVar11 = length;
  if (3 < (int)length) {
    do {
      dVar17 = *(double *)&p_Var7->_M_use_count;
      pp_Var1 = p_Var7[1]._vptr__Sp_counted_base;
      dVar22 = *(double *)&p_Var7[1]._M_use_count;
      (_Var8._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)((double)p_Var7->_vptr__Sp_counted_base - value2);
      *(double *)&(_Var8._M_pi)->_M_use_count = dVar17 - value2;
      _Var8._M_pi[1]._vptr__Sp_counted_base = (_func_int **)((double)pp_Var1 - value2);
      *(double *)&_Var8._M_pi[1]._M_use_count = dVar22 - value2;
      iVar5 = (int)uVar9;
      uVar11 = iVar5 - 4;
      p_Var7 = p_Var7 + 2;
      _Var8._M_pi = _Var8._M_pi + 2;
      uVar9 = (ulong)uVar11;
    } while (7 < iVar5);
  }
  if (1 < (int)uVar11) {
    dVar17 = *(double *)&p_Var7->_M_use_count;
    (_Var8._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)((double)p_Var7->_vptr__Sp_counted_base - value2);
    *(double *)&(_Var8._M_pi)->_M_use_count = dVar17 - value2;
    uVar11 = uVar11 - 2;
    p_Var7 = p_Var7 + 1;
    _Var8._M_pi = _Var8._M_pi + 1;
  }
  if (uVar11 != 0) {
    (_Var8._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)((double)p_Var7->_vptr__Sp_counted_base - value2);
  }
  if (length != 0) {
    uVar9 = 0;
    do {
      if (((double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                     ->_vptr__Sp_counted_base)[uVar9] != dVar18) ||
         (NAN((double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)->_vptr__Sp_counted_base)[uVar9]) || NAN(dVar18))) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar6 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
        *(undefined4 *)(puVar6 + 1) = 0x4b;
        *(uint *)((long)puVar6 + 0xc) = length;
        __cxa_throw(puVar6,&Exception::typeinfo,0);
      }
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
  }
  _Var8._M_pi = pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var7 = local_60;
  uVar9 = uVar2;
  uVar11 = length;
  if (3 < (int)length) {
    do {
      dVar17 = *(double *)&p_Var7->_M_use_count;
      pp_Var1 = p_Var7[1]._vptr__Sp_counted_base;
      dVar18 = *(double *)&p_Var7[1]._M_use_count;
      (_Var8._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)(value2 - (double)p_Var7->_vptr__Sp_counted_base);
      *(double *)&(_Var8._M_pi)->_M_use_count = value2 - dVar17;
      _Var8._M_pi[1]._vptr__Sp_counted_base = (_func_int **)(value2 - (double)pp_Var1);
      *(double *)&_Var8._M_pi[1]._M_use_count = value2 - dVar18;
      iVar5 = (int)uVar9;
      uVar11 = iVar5 - 4;
      p_Var7 = p_Var7 + 2;
      _Var8._M_pi = _Var8._M_pi + 2;
      uVar9 = (ulong)uVar11;
    } while (7 < iVar5);
  }
  if (1 < (int)uVar11) {
    dVar17 = *(double *)&p_Var7->_M_use_count;
    (_Var8._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)(value2 - (double)p_Var7->_vptr__Sp_counted_base);
    *(double *)&(_Var8._M_pi)->_M_use_count = value2 - dVar17;
    uVar11 = uVar11 - 2;
    p_Var7 = p_Var7 + 1;
    _Var8._M_pi = _Var8._M_pi + 1;
  }
  if (uVar11 != 0) {
    (_Var8._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)(value2 - (double)p_Var7->_vptr__Sp_counted_base);
  }
  if (length != 0) {
    uVar9 = 0;
    do {
      dVar17 = (double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_vptr__Sp_counted_base)[uVar9] - (value2 - value1);
      uVar12 = -(ulong)(dVar17 < 0.0);
      if (2.220446049250313e-16 <=
          (double)(~uVar12 & (ulong)dVar17 |
                  (ulong)((value2 - value1) -
                         (double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar9]) & uVar12)) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar6 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
        *(undefined4 *)(puVar6 + 1) = 0x53;
        *(uint *)((long)puVar6 + 0xc) = length;
        __cxa_throw(puVar6,&Exception::typeinfo,0);
      }
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
  }
  _Var8._M_pi = pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var7 = local_60;
  uVar9 = uVar2;
  uVar11 = length;
  if (3 < (int)length) {
    do {
      dVar17 = *(double *)&p_Var7->_M_use_count;
      pp_Var1 = p_Var7[1]._vptr__Sp_counted_base;
      dVar18 = *(double *)&p_Var7[1]._M_use_count;
      (_Var8._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)((double)p_Var7->_vptr__Sp_counted_base * value2);
      *(double *)&(_Var8._M_pi)->_M_use_count = dVar17 * value2;
      _Var8._M_pi[1]._vptr__Sp_counted_base = (_func_int **)((double)pp_Var1 * value2);
      *(double *)&_Var8._M_pi[1]._M_use_count = dVar18 * value2;
      iVar5 = (int)uVar9;
      uVar11 = iVar5 - 4;
      p_Var7 = p_Var7 + 2;
      _Var8._M_pi = _Var8._M_pi + 2;
      uVar9 = (ulong)uVar11;
    } while (7 < iVar5);
  }
  if (1 < (int)uVar11) {
    dVar17 = *(double *)&p_Var7->_M_use_count;
    (_Var8._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)((double)p_Var7->_vptr__Sp_counted_base * value2);
    *(double *)&(_Var8._M_pi)->_M_use_count = dVar17 * value2;
    uVar11 = uVar11 - 2;
    p_Var7 = p_Var7 + 1;
    _Var8._M_pi = _Var8._M_pi + 1;
  }
  if (uVar11 != 0) {
    (_Var8._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)((double)p_Var7->_vptr__Sp_counted_base * value2);
  }
  if (length != 0) {
    uVar9 = 0;
    do {
      if (((double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                     ->_vptr__Sp_counted_base)[uVar9] != dVar19) ||
         (NAN((double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi)->_vptr__Sp_counted_base)[uVar9]) || NAN(dVar19))) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar6 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
        *(undefined4 *)(puVar6 + 1) = 0x5b;
        *(uint *)((long)puVar6 + 0xc) = length;
        __cxa_throw(puVar6,&Exception::typeinfo,0);
      }
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
  }
  _Var8._M_pi = pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var7 = local_60;
  uVar9 = uVar2;
  uVar11 = length;
  if (3 < (int)length) {
    do {
      _Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               divpd((undefined1  [16])*p_Var7,(undefined1  [16])_Var13);
      _Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               divpd((undefined1  [16])p_Var7[1],(undefined1  [16])_Var13);
      *_Var8._M_pi = _Var15;
      _Var8._M_pi[1] = _Var20;
      iVar5 = (int)uVar9;
      uVar11 = iVar5 - 4;
      p_Var7 = p_Var7 + 2;
      _Var8._M_pi = _Var8._M_pi + 2;
      uVar9 = (ulong)uVar11;
    } while (7 < iVar5);
  }
  if (1 < (int)uVar11) {
    _Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
             divpd((undefined1  [16])*p_Var7,(undefined1  [16])_Var13);
    *_Var8._M_pi = _Var15;
    uVar11 = uVar11 - 2;
    p_Var7 = p_Var7 + 1;
    _Var8._M_pi = _Var8._M_pi + 1;
  }
  if (uVar11 != 0) {
    (_Var8._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)((double)p_Var7->_vptr__Sp_counted_base / value2);
  }
  if (length != 0) {
    uVar9 = 0;
    do {
      dVar17 = (double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_vptr__Sp_counted_base)[uVar9] - dVar21;
      uVar12 = -(ulong)(dVar17 < 0.0);
      if (2.220446049250313e-16 <=
          (double)(~uVar12 & (ulong)dVar17 |
                  (ulong)(dVar21 - (double)(&(pv2.
                                              super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar9]) &
                  uVar12)) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar6 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
        *(undefined4 *)(puVar6 + 1) = 99;
        *(uint *)((long)puVar6 + 0xc) = length;
        __cxa_throw(puVar6,&Exception::typeinfo,0);
      }
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
  }
  p_Var7 = local_60;
  _Var8._M_pi = pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  uVar9 = uVar2;
  uVar11 = length;
  if (3 < (int)length) {
    do {
      auVar14._8_8_ = value2;
      auVar14._0_8_ = value2;
      _Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               divpd(auVar14,(undefined1  [16])*p_Var7);
      auVar16._8_8_ = value2;
      auVar16._0_8_ = value2;
      _Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               divpd(auVar16,(undefined1  [16])p_Var7[1]);
      *_Var8._M_pi = _Var15;
      _Var8._M_pi[1] = _Var20;
      iVar5 = (int)uVar9;
      uVar11 = iVar5 - 4;
      p_Var7 = p_Var7 + 2;
      _Var8._M_pi = _Var8._M_pi + 2;
      uVar9 = (ulong)uVar11;
    } while (7 < iVar5);
  }
  if (1 < (int)uVar11) {
    _Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
             divpd((undefined1  [16])_Var13,(undefined1  [16])*p_Var7);
    *_Var8._M_pi = _Var13;
    uVar11 = uVar11 - 2;
    p_Var7 = p_Var7 + 1;
    _Var8._M_pi = _Var8._M_pi + 1;
  }
  if (uVar11 != 0) {
    (_Var8._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)(value2 / (double)p_Var7->_vptr__Sp_counted_base);
  }
  if (length != 0) {
    uVar9 = 0;
    do {
      dVar17 = (double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_vptr__Sp_counted_base)[uVar9] - value2 / value1;
      uVar12 = -(ulong)(dVar17 < 0.0);
      if (2.220446049250313e-16 <=
          (double)(~uVar12 & (ulong)dVar17 |
                  (ulong)(value2 / value1 -
                         (double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base)[uVar9]) & uVar12)) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar6 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
        *(undefined4 *)(puVar6 + 1) = 0x6b;
        *(uint *)((long)puVar6 + 0xc) = length;
        __cxa_throw(puVar6,&Exception::typeinfo,0);
      }
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
  }
  if ((!allowTrash) &&
     (((double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                 _vptr__Sp_counted_base)[uVar2] != 127.0 ||
      (NAN((double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                     ->_vptr__Sp_counted_base)[uVar2]))))) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar6 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
    *(undefined4 *)(puVar6 + 1) = 0x70;
    *(uint *)((long)puVar6 + 0xc) = length;
    __cxa_throw(puVar6,&Exception::typeinfo,0);
  }
  if (presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               presult.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}